

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Location.cpp
# Opt level: O0

string * Location::get_location(string *__return_storage_ptr__,string *ip_addr)

{
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  *this;
  bool bVar1;
  Response *pRVar2;
  reference pvVar3;
  ostream *this_00;
  void *this_01;
  allocator<char> local_4b5;
  int local_4b4;
  string local_4b0;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_34a;
  allocator<char> local_349;
  key_type local_348;
  allocator<char> local_321;
  key_type local_320;
  allocator<char> local_2f9;
  key_type local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  key_type local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator<char> local_269;
  key_type local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator<char> local_221;
  key_type local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator<char> local_1d9;
  key_type local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  float local_198;
  float local_194;
  float longitude;
  float latitude;
  string zip;
  string city;
  string region_name;
  string country;
  string continent;
  undefined1 local_d0 [8];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  response;
  string rs;
  Result res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string address;
  Client client;
  string *ip_addr_local;
  string *result;
  
  httplib::Client::Client((Client *)((long)&address.field_2 + 8),"http://api.ipstack.com");
  std::operator+(&local_80,"/",ip_addr);
  std::operator+(&local_60,&local_80,"?access_key=");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ipStackAccessKey_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::c_str();
  httplib::Client::Get((Client *)((long)&rs.field_2 + 8),address.field_2._M_local_buf + 8);
  bVar1 = httplib::Result::operator_cast_to_bool((Result *)((long)&rs.field_2 + 8));
  if (bVar1) {
    pRVar2 = httplib::Result::operator->((Result *)((long)&rs.field_2 + 8));
    if (pRVar2->status == 200) {
      pRVar2 = httplib::Result::operator->((Result *)((long)&rs.field_2 + 8));
      std::__cxx11::string::string((string *)&response.m_value.boolean,(string *)&pRVar2->body);
      this = (function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
              *)((long)&continent.field_2 + 8);
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::function(this,(nullptr_t)0x0);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<std::__cxx11::string&>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &response.m_value,this,true,false);
      std::
      function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
      ::~function((function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
                   *)((long)&continent.field_2 + 8));
      std::__cxx11::string::string((string *)(country.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(region_name.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(city.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(zip.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&longitude);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"continent_name",&local_1d9);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0,&local_1d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_1b8,pvVar3);
      std::__cxx11::string::operator=
                ((string *)(country.field_2._M_local_buf + 8),(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"country_name",&local_221);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0,&local_220);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_200,pvVar3);
      std::__cxx11::string::operator=
                ((string *)(region_name.field_2._M_local_buf + 8),(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"region_name",&local_269);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0,&local_268);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_248,pvVar3);
      std::__cxx11::string::operator=
                ((string *)(city.field_2._M_local_buf + 8),(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"city",&local_2b1);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0,&local_2b0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_290,pvVar3);
      std::__cxx11::string::operator=((string *)(zip.field_2._M_local_buf + 8),(string *)&local_290)
      ;
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"zip",&local_2f9);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0,&local_2f8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2d8,pvVar3);
      std::__cxx11::string::operator=((string *)&longitude,(string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"latitude",&local_321)
      ;
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0,&local_320);
      local_194 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator_float<float,_0>(pvVar3);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator(&local_321);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"longitude",&local_349);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0,&local_348);
      local_198 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator_float<float,_0>(pvVar3);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      local_34a = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Location: ");
      std::operator+(&local_370,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&zip.field_2 + 8),", ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::operator+(&local_390,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&city.field_2 + 8),", ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::operator+(&local_3b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&region_name.field_2 + 8),", ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::operator+(&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&country.field_2 + 8),"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::operator+(&local_3f0,"Zip: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&longitude
                    );
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::to_string(&local_490,local_194);
      std::operator+(&local_470,", Coordinates: ",&local_490);
      std::operator+(&local_450,&local_470,",");
      std::__cxx11::to_string(&local_4b0,local_198);
      std::operator+(&local_430,&local_450,&local_4b0);
      std::operator+(&local_410,&local_430,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_490);
      local_34a = 1;
      local_4b4 = 1;
      std::__cxx11::string::~string((string *)&longitude);
      std::__cxx11::string::~string((string *)(zip.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(city.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(region_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(country.field_2._M_local_buf + 8));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_d0);
      std::__cxx11::string::~string((string *)&response.m_value.boolean);
      goto LAB_0011145a;
    }
    this_00 = std::operator<<((ostream *)&std::cout,"Error Fetching IP, Status Code ");
    pRVar2 = httplib::Result::operator->((Result *)((long)&rs.field_2 + 8));
    this_01 = (void *)std::ostream::operator<<(this_00,pRVar2->status);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  local_4b4 = 0;
LAB_0011145a:
  httplib::Result::~Result((Result *)((long)&rs.field_2 + 8));
  if (local_4b4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Cannot Determine Location",&local_4b5);
    std::allocator<char>::~allocator(&local_4b5);
    local_4b4 = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  httplib::Client::~Client((Client *)((long)&address.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Location::get_location(const std::string &ip_addr) {
	httplib::Client client("http://api.ipstack.com");
	std::string address = "/" + ip_addr + "?access_key=" + Location::ipStackAccessKey;

	if (auto res = client.Get(address.c_str())) {
		if (res->status == 200) {
			std::string rs = res->body;
			auto response = nlohmann::json::parse(rs);

			std::string continent, country, region_name, city, zip;
			float latitude, longitude;

			try {
				continent = response.at("continent_name");
				country = response.at("country_name");
				region_name = response.at("region_name");
				city = response.at("city");
				zip = response.at("zip");
				latitude = response.at("latitude");
				longitude = response.at("longitude");
			} catch (...) {
				// do nothing, let the particular string be empty
			}

			std::string result;
			result += "Location: ";
			result += city + ", ";
			result += region_name + ", ";
			result += country + ", ";
			result += continent + "\n";
			result += "Zip: " + zip;
			result += ", Coordinates: " + std::to_string(latitude) + "," + std::to_string(longitude) + "\n";

			return result;

		} else {
			std::cout << "Error Fetching IP, Status Code " << res->status << std::endl;
		}
	}

	return "Cannot Determine Location";
}